

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O0

Element_conflict
Gudhi::persistence_fields::Zp_field_element<2u,unsigned_int,void>::_get_value<unsigned_int,void>
          (uint e)

{
  undefined4 local_10;
  uint e_local;
  
  local_10 = e;
  if (1 < e) {
    local_10 = e & 1;
  }
  return local_10;
}

Assistant:

static constexpr Element _get_value(Integer_type e) {
    if constexpr (std::is_signed_v<Integer_type>) {
      if (e < -static_cast<Integer_type>(characteristic)) e = e % characteristic;
      if (e < 0) return e += characteristic;
      return e < static_cast<Integer_type>(characteristic) ? e : e % characteristic;
    } else {
      return e < characteristic ? e : e % characteristic;
    }
  }